

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O2

int fits_rdecomp_short(uchar *c,int clen,unsigned_short *array,int nx,int nblock)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  char *err_message;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  
  uVar6 = (uint)(ushort)(*(ushort *)c << 8 | *(ushort *)c >> 8);
  uVar9 = (uint)c[2];
  pbVar7 = c + 3;
  lVar13 = 0;
  iVar8 = 8;
  do {
    iVar3 = (int)lVar13;
    if (nx <= iVar3) {
      iVar8 = 0;
      if (c + clen <= pbVar7) {
        return 0;
      }
      err_message = "decompression warning: unused bytes at end of compressed buffer";
      goto LAB_001f1b20;
    }
    iVar12 = 0xc - iVar8;
    for (iVar8 = iVar8 + -4; iVar8 < 0; iVar8 = iVar8 + 8) {
      bVar1 = *pbVar7;
      pbVar7 = pbVar7 + 1;
      uVar9 = uVar9 << 8 | (uint)bVar1;
      iVar12 = iVar12 + -8;
    }
    uVar4 = uVar9 >> ((byte)iVar8 & 0x1f);
    uVar11 = ~(-1 << ((byte)iVar8 & 0x1f));
    uVar9 = uVar9 & uVar11;
    iVar2 = iVar3 + nblock;
    if (nx <= iVar3 + nblock) {
      iVar2 = nx;
    }
    iVar5 = uVar4 - 1;
    lVar10 = (long)iVar2;
    if (iVar5 < 0) {
      for (lVar13 = (long)iVar3; lVar13 < lVar10; lVar13 = lVar13 + 1) {
        array[lVar13] = (unsigned_short)uVar6;
      }
    }
    else if (iVar5 == 0xe) {
      for (lVar13 = (long)iVar3; lVar13 < lVar10; lVar13 = lVar13 + 1) {
        uVar4 = uVar9 << ((char)iVar12 + 8U & 0x1f);
        for (iVar3 = iVar12; -1 < iVar3; iVar3 = iVar3 + -8) {
          bVar1 = *pbVar7;
          pbVar7 = pbVar7 + 1;
          uVar4 = uVar4 | (uint)bVar1 << ((byte)iVar3 & 0x1f);
        }
        if (iVar8 == 0) {
          uVar9 = 0;
        }
        else {
          bVar1 = *pbVar7;
          pbVar7 = pbVar7 + 1;
          uVar4 = uVar4 | bVar1 >> (-(byte)iVar3 & 0x1f);
          uVar9 = bVar1 & uVar11;
        }
        uVar6 = uVar6 + (-(uVar4 & 1) ^ uVar4 >> 1);
        array[lVar13] = (unsigned_short)uVar6;
      }
    }
    else {
      for (lVar13 = (long)iVar3; lVar13 < lVar10; lVar13 = lVar13 + 1) {
        while (uVar9 == 0) {
          iVar8 = iVar8 + 8;
          bVar1 = *pbVar7;
          pbVar7 = pbVar7 + 1;
          uVar9 = (uint)bVar1;
        }
        iVar3 = iVar8 - nonzero_count[uVar9];
        uVar4 = nonzero_count[uVar9] - 1;
        uVar9 = uVar9 ^ 1 << (uVar4 & 0x1f);
        for (iVar8 = uVar4 - iVar5; iVar8 < 0; iVar8 = iVar8 + 8) {
          bVar1 = *pbVar7;
          pbVar7 = pbVar7 + 1;
          uVar9 = uVar9 << 8 | (uint)bVar1;
        }
        uVar4 = uVar9 >> ((byte)iVar8 & 0x1f) | iVar3 << ((byte)iVar5 & 0x1f);
        uVar9 = uVar9 & ~(-1 << ((byte)iVar8 & 0x1f));
        uVar6 = uVar6 + (-(uVar4 & 1) ^ uVar4 >> 1);
        array[lVar13] = (unsigned_short)uVar6;
      }
    }
  } while (pbVar7 <= c + clen);
  iVar8 = 1;
  err_message = "decompression error: hit end of compressed byte stream";
LAB_001f1b20:
  ffpmsg(err_message);
  return iVar8;
}

Assistant:

int fits_rdecomp_short (unsigned char *c,		/* input buffer			*/
	     int clen,			/* length of input		*/
	     unsigned short array[],  	/* output array			*/
	     int nx,			/* number of output pixels	*/
	     int nblock)		/* coding block size		*/
{
int i, imax;
/* int bsize; */
int k;
int nbits, nzero, fs;
unsigned char *cend, bytevalue;
unsigned int b, diff, lastpix;
int fsmax, fsbits, bbits;
extern const int nonzero_count[];

   /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */

/*    bsize = 2; */
    
/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return 1;
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 4;
    fsmax = 14;

    bbits = 1<<fsbits;

    /*
     * Decode in blocks of nblock pixels
     */

    /* first 2 bytes of input buffer contain the value of the first */
    /* 2 byte integer value, without any encoding */
    
    lastpix = 0;
    bytevalue = c[0];
    lastpix = lastpix | (bytevalue<<8);
    bytevalue = c[1];
    lastpix = lastpix | bytevalue;

    c += 2;  
    cend = c + clen - 2;

    b = *c++;		    /* bit buffer			*/
    nbits = 8;		    /* number of bits remaining in b	*/
    for (i = 0; i<nx; ) {
	/* get the FS value from first fsbits */
	nbits -= fsbits;
	while (nbits < 0) {
	    b = (b<<8) | (*c++);
	    nbits += 8;
	}
	fs = (b >> nbits) - 1;

	b &= (1<<nbits)-1;
	/* loop over the next block */
	imax = i + nblock;
	if (imax > nx) imax = nx;
	if (fs<0) {
	    /* low-entropy case, all zero differences */
	    for ( ; i<imax; i++) array[i] = lastpix;
	} else if (fs==fsmax) {
	    /* high-entropy case, directly coded pixel values */
	    for ( ; i<imax; i++) {
		k = bbits - nbits;
		diff = b<<k;
		for (k -= 8; k >= 0; k -= 8) {
		    b = *c++;
		    diff |= b<<k;
		}
		if (nbits>0) {
		    b = *c++;
		    diff |= b>>(-k);
		    b &= (1<<nbits)-1;
		} else {
		    b = 0;
		}
   
		/*
		 * undo mapping and differencing
		 * Note that some of these operations will overflow the
		 * unsigned int arithmetic -- that's OK, it all works
		 * out to give the right answers in the output file.
		 */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	} else {
	    /* normal case, Rice coding */
	    for ( ; i<imax; i++) {
		/* count number of leading zeros */
		while (b == 0) {
		    nbits += 8;
		    b = *c++;
		}
		nzero = nbits - nonzero_count[b];
		nbits -= nzero+1;
		/* flip the leading one-bit */
		b ^= 1<<nbits;
		/* get the FS trailing bits */
		nbits -= fs;
		while (nbits < 0) {
		    b = (b<<8) | (*c++);
		    nbits += 8;
		}
		diff = (nzero<<fs) | (b>>nbits);
		b &= (1<<nbits)-1;

		/* undo mapping and differencing */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	}
	if (c > cend) {
            ffpmsg("decompression error: hit end of compressed byte stream");
	    return 1;
	}
    }
    if (c < cend) {
        ffpmsg("decompression warning: unused bytes at end of compressed buffer");
    }
    return 0;
}